

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetAndClearExceptionWithMetadata(JsValueRef *metadata)

{
  code *pcVar1;
  anon_class_32_4_ab4b346c fn;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  ThreadContext *pTVar5;
  Var pvVar6;
  JavascriptExceptionObject *in_stack_ffffffffffffff78;
  Var exception;
  OutOfMemoryException anon_var_0;
  AutoHandledExceptionType local_39;
  JavascriptExceptionObject *pJStack_38;
  AutoHandledExceptionType __autoHandledExceptionType;
  JavascriptExceptionObject *recordedException;
  ScriptContext *pSStack_28;
  HRESULT hr;
  ScriptContext *scriptContext;
  JsrtContext *currentContext;
  JsValueRef *metadata_local;
  
  if (metadata == (JsValueRef *)0x0) {
    metadata_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *metadata = (JsValueRef)0x0;
    currentContext = (JsrtContext *)metadata;
    scriptContext = (ScriptContext *)JsrtContext::GetCurrent();
    if (scriptContext == (ScriptContext *)0x0) {
      metadata_local._4_4_ = JsErrorNoCurrentContext;
    }
    else {
      pSStack_28 = JsrtContext::GetScriptContext((JsrtContext *)scriptContext);
      if (pSStack_28 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                           ,0x45f,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar4 = Js::ScriptContext::GetRecycler(pSStack_28);
      if (pRVar4 != (Recycler *)0x0) {
        pRVar4 = Js::ScriptContext::GetRecycler(pSStack_28);
        bVar2 = Memory::Recycler::IsHeapEnumInProgress(pRVar4);
        if (bVar2) {
          return JsErrorHeapEnumInProgress;
        }
      }
      pTVar5 = Js::ScriptContext::GetThreadContext(pSStack_28);
      bVar2 = ThreadContext::IsInThreadServiceCallback(pTVar5);
      if (bVar2) {
        metadata_local._4_4_ = JsErrorInThreadServiceCallback;
      }
      else {
        pTVar5 = Js::ScriptContext::GetThreadContext(pSStack_28);
        bVar2 = ThreadContext::IsExecutionDisabled(pTVar5);
        if (bVar2) {
          metadata_local._4_4_ = JsErrorInDisabledState;
        }
        else {
          recordedException._4_4_ = 0;
          pJStack_38 = (JavascriptExceptionObject *)0x0;
          AutoHandledExceptionType::AutoHandledExceptionType(&local_39,ExceptionType_OutOfMemory);
          bVar2 = Js::ScriptContext::HasRecordedException(pSStack_28);
          if (bVar2) {
            in_stack_ffffffffffffff78 =
                 Js::ScriptContext::GetAndClearRecordedException(pSStack_28,(bool *)0x0);
            pJStack_38 = in_stack_ffffffffffffff78;
          }
          AutoHandledExceptionType::~AutoHandledExceptionType(&local_39);
          if (recordedException._4_4_ == -0x7ff8fff2) {
            pTVar5 = Js::ScriptContext::GetThreadContext(pSStack_28);
            pJStack_38 = ThreadContext::GetRecordedException(pTVar5);
          }
          if (pJStack_38 == (JavascriptExceptionObject *)0x0) {
            metadata_local._4_4_ = JsErrorInvalidArgument;
          }
          else {
            pvVar6 = Js::JavascriptExceptionObject::GetThrownObject(pJStack_38,(ScriptContext *)0x0)
            ;
            if (pvVar6 == (Var)0x0) {
              metadata_local._4_4_ = JsErrorInvalidArgument;
            }
            else {
              fn.recordedException = (JavascriptExceptionObject **)&currentContext;
              fn.exception = &stack0xffffffffffffffc8;
              fn.metadata = (JsValueRef **)((long)&recordedException + 4);
              fn.hr = (HRESULT *)in_stack_ffffffffffffff78;
              metadata_local._4_4_ =
                   ContextAPIWrapper<false,JsGetAndClearExceptionWithMetadata::__0>(fn);
            }
          }
        }
      }
    }
  }
  return metadata_local._4_4_;
}

Assistant:

CHAKRA_API JsGetAndClearExceptionWithMetadata(_Out_ JsValueRef *metadata)
{
    PARAM_NOT_NULL(metadata);
    *metadata = nullptr;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);

    if (scriptContext->GetRecycler() && scriptContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (scriptContext->GetThreadContext()->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    HRESULT hr = S_OK;
    Js::JavascriptExceptionObject *recordedException = nullptr;

    BEGIN_TRANSLATE_OOM_TO_HRESULT
        if (scriptContext->HasRecordedException())
        {
            recordedException = scriptContext->GetAndClearRecordedException();
        }
    END_TRANSLATE_OOM_TO_HRESULT(hr)

        if (hr == E_OUTOFMEMORY)
        {
            recordedException = scriptContext->GetThreadContext()->GetRecordedException();
        }
    if (recordedException == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    Js::Var exception = recordedException->GetThrownObject(nullptr);

    if (exception == nullptr)
    {
        // TODO: How does this early bailout impact TTD?
        return JsErrorInvalidArgument;
    }

    return ContextAPIWrapper<false>([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        Js::Var exceptionMetadata = Js::JavascriptExceptionMetadata::CreateMetadataVar(scriptContext);
        Js::JavascriptOperators::OP_SetProperty(exceptionMetadata, Js::PropertyIds::exception, exception, scriptContext);

        Js::FunctionBody *functionBody = recordedException->GetFunctionBody();
        if (functionBody == nullptr)
        {
            // This is probably a parse error. We can get the error location metadata from the thrown object.
            Js::JavascriptExceptionMetadata::PopulateMetadataFromCompileException(exceptionMetadata, exception, scriptContext);
        }
        else
        {
            if (!Js::JavascriptExceptionMetadata::PopulateMetadataFromException(exceptionMetadata, recordedException, scriptContext))
            {
                return JsErrorInvalidArgument;
            }
        }

        *metadata = exceptionMetadata;

#if ENABLE_TTD
        if (hr != E_OUTOFMEMORY)
        {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetAndClearExceptionWithMetadata);
            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, metadata);
        }
#endif


        return JsNoError;
    });
}